

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_dump(char *filename,int parts,uint64_t nskip,uint64_t nlimit)

{
  mcpl_file_t ff;
  int in_ESI;
  _func_int_mcpl_particle_t_ptr *in_RDI;
  char *unaff_retaddr;
  char *bn;
  mcpl_file_t f;
  char *in_stack_ffffffffffffffc8;
  
  if ((in_ESI < 0) || (2 < in_ESI)) {
    mcpl_error((char *)0x105d81);
  }
  mcpl_open_file(in_stack_ffffffffffffffc8);
  ff.internal = mcpl_basename(unaff_retaddr);
  printf("Opened MCPL file %s:\n",ff.internal);
  free(ff.internal);
  if ((in_ESI == 0) || (in_ESI == 1)) {
    mcpl_dump_header(f);
  }
  if ((in_ESI == 0) || (in_ESI == 2)) {
    mcpl_dump_particles(f,(uint64_t)bn,(uint64_t)unaff_retaddr,in_RDI);
  }
  mcpl_close_file(ff);
  return;
}

Assistant:

void mcpl_dump(const char * filename, int parts, uint64_t nskip, uint64_t nlimit)
{
  if (parts<0||parts>2)
    mcpl_error("mcpl_dump got forbidden value for argument parts");
  mcpl_file_t f = mcpl_open_file(filename);
  {
    char * bn = mcpl_basename(filename);
    printf("Opened MCPL file %s:\n",bn);
    free(bn);
  }
  if (parts==0||parts==1)
    mcpl_dump_header(f);
  if (parts==0||parts==2)
    mcpl_dump_particles(f,nskip,nlimit,NULL);
  mcpl_close_file(f);
}